

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QMakeParser::BlockScope>::copyAppend
          (QGenericArrayOps<QMakeParser::BlockScope> *this,BlockScope *b,BlockScope *e)

{
  qsizetype *pqVar1;
  BlockScope *pBVar2;
  BlockScope *pBVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uchar uVar7;
  undefined1 uVar8;
  
  if (b != e) {
    pBVar3 = (this->super_QArrayDataPointer<QMakeParser::BlockScope>).ptr;
    for (; b < e; b = b + 1) {
      iVar4 = b->braceLevel;
      bVar5 = b->special;
      bVar6 = b->inBranch;
      uVar7 = b->nest;
      uVar8 = b->field_0xf;
      pBVar2 = pBVar3 + (this->super_QArrayDataPointer<QMakeParser::BlockScope>).size;
      pBVar2->start = b->start;
      pBVar2->braceLevel = iVar4;
      pBVar2->special = bVar5;
      pBVar2->inBranch = bVar6;
      pBVar2->nest = uVar7;
      pBVar2->field_0xf = uVar8;
      pqVar1 = &(this->super_QArrayDataPointer<QMakeParser::BlockScope>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }